

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::hugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStringOperator<duckdb::TryCastToUUID>>
               (string_t *ldata,hugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  TemplatedValidityData<unsigned_long> *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t idx;
  ulong idx_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  string_t input;
  string_t input_00;
  string_t input_01;
  hugeint_t hVar11;
  ulong local_80;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  idx_t local_38;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar5 = 8;
      idx = 0;
      do {
        input.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar5);
        input.value._0_8_ = *(undefined8 *)((long)ldata + lVar5 + -8);
        hVar11 = VectorTryCastStringOperator<duckdb::TryCastToUUID>::
                 Operation<duckdb::string_t,duckdb::hugeint_t>(input,result_mask,idx,dataptr);
        *(uint64_t *)((long)result_data + lVar5 + -8) = hVar11.lower;
        *(int64_t *)((long)&result_data->lower + lVar5) = hVar11.upper;
        idx = idx + 1;
        lVar5 = lVar5 + 0x10;
      } while (count != idx);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_48,(unsigned_long **)mask,&local_38);
      p_Var3 = p_Stack_40;
      peVar2 = local_48;
      local_48 = (element_type *)0x0;
      p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar2;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
      pTVar4 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar4->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar1;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_80 = 0;
      idx_00 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar6 = idx_00 + 0x40;
          if (count <= idx_00 + 0x40) {
            uVar6 = count;
          }
LAB_00fd28e1:
          uVar7 = idx_00;
          if (idx_00 < uVar6) {
            uVar9 = idx_00 << 4 | 8;
            do {
              input_01.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar9);
              input_01.value._0_8_ = *(undefined8 *)((long)ldata + (uVar9 - 8));
              hVar11 = VectorTryCastStringOperator<duckdb::TryCastToUUID>::
                       Operation<duckdb::string_t,duckdb::hugeint_t>
                                 (input_01,result_mask,idx_00,dataptr);
              *(uint64_t *)((long)result_data + (uVar9 - 8)) = hVar11.lower;
              *(int64_t *)((long)&result_data->lower + uVar9) = hVar11.upper;
              idx_00 = idx_00 + 1;
              uVar9 = uVar9 + 0x10;
              uVar7 = uVar6;
            } while (uVar6 != idx_00);
          }
        }
        else {
          uVar9 = puVar1[local_80];
          uVar6 = idx_00 + 0x40;
          if (count <= idx_00 + 0x40) {
            uVar6 = count;
          }
          uVar7 = uVar6;
          if (uVar9 != 0) {
            if (uVar9 == 0xffffffffffffffff) goto LAB_00fd28e1;
            uVar7 = idx_00;
            if (idx_00 < uVar6) {
              uVar10 = idx_00 << 4 | 8;
              uVar8 = 0;
              do {
                if ((uVar9 >> (uVar8 & 0x3f) & 1) != 0) {
                  input_00.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar10)
                  ;
                  input_00.value._0_8_ = *(undefined8 *)((long)ldata + (uVar10 - 8));
                  hVar11 = VectorTryCastStringOperator<duckdb::TryCastToUUID>::
                           Operation<duckdb::string_t,duckdb::hugeint_t>
                                     (input_00,result_mask,uVar8 + idx_00,dataptr);
                  *(uint64_t *)((long)result_data + (uVar10 - 8)) = hVar11.lower;
                  *(int64_t *)((long)&result_data->lower + uVar10) = hVar11.upper;
                }
                uVar8 = uVar8 + 1;
                uVar10 = uVar10 + 0x10;
                uVar7 = uVar6;
              } while (uVar6 - idx_00 != uVar8);
            }
          }
        }
        local_80 = local_80 + 1;
        idx_00 = uVar7;
      } while (local_80 != count + 0x3f >> 6);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}